

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# denoise.c
# Opt level: O1

float rnnoise_process_frame(DenoiseState *st,float *out,float *in)

{
  int iVar1;
  double dVar2;
  long lVar3;
  float (*pafVar4) [22];
  float *pfVar5;
  float (*pafVar6) [22];
  int k;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  int i;
  long lVar10;
  byte bVar11;
  opus_val16 oVar12;
  float fVar13;
  float fVar14;
  float mindist;
  float fVar15;
  float fVar16;
  float dist;
  float fVar17;
  float vad_prob;
  int pitch_index;
  float *pre [1];
  float features [42];
  float Exp [22];
  float g [22];
  float Ex [22];
  float Ep [22];
  kiss_fft_cpx X [481];
  float Ly [22];
  float gf [481];
  float p [960];
  float x [480];
  float pitch_buf [864];
  kiss_fft_cpx P [960];
  float local_89a4;
  float local_89a0;
  float local_899c;
  float local_8998;
  int local_8994;
  float *local_8990;
  float local_8988 [22];
  float afStack_8930 [6];
  float afStack_8918 [6];
  float local_8900;
  float fStack_88fc;
  undefined8 uStack_88f8;
  undefined8 local_88f0;
  float local_88e8;
  float local_88e4;
  float local_88d8 [24];
  float local_8878 [2];
  undefined8 uStack_8870;
  undefined8 local_8868;
  float local_8818 [24];
  float local_87b8 [24];
  kiss_fft_cpx local_8758 [482];
  float local_7848 [480];
  undefined1 local_70c8 [1920];
  float local_6948 [484];
  kiss_fft_cpx local_61b8;
  float afStack_61b0 [478];
  undefined1 local_5a38 [1928];
  float local_52b0 [958];
  float local_43b8 [480];
  kiss_fft_cpx local_3c38;
  float afStack_3c30 [382];
  opus_val16 local_3638 [1536];
  kiss_fft_cpx local_1e38 [961];
  
  bVar11 = 0;
  lVar10 = 0;
  memset(local_6948,0,0x784);
  local_6948[0] = 1.0;
  local_89a4 = 0.0;
  fVar14 = st->mem_hp_x[0];
  fVar16 = st->mem_hp_x[1];
  do {
    fVar13 = in[lVar10];
    fVar15 = fVar14 + fVar13;
    fVar17 = fVar15 * -0.996 + fVar13;
    fVar14 = (fVar15 * 1.99599 - (fVar13 + fVar13)) + fVar16;
    st->mem_hp_x[0] = fVar14;
    st->mem_hp_x[1] = fVar17;
    local_43b8[lVar10] = fVar15;
    lVar10 = lVar10 + 1;
    fVar16 = fVar17;
  } while (lVar10 != 0x1e0);
  memcpy(&local_61b8,st,0x780);
  memcpy(local_5a38,local_43b8,0x780);
  memcpy(st,local_43b8,0x780);
  apply_window(&local_61b8.r);
  forward_transform(local_8758,&local_61b8.r);
  compute_band_energy(local_8818,local_8758);
  pfVar5 = st->pitch_buf;
  memmove(pfVar5,st->pitch_buf + 0x1e0,0x1380);
  memcpy(st->pitch_buf + 0x4e0,local_43b8,0x780);
  local_8990 = pfVar5;
  pitch_downsample(&local_8990,&local_3c38.r,0x6c0,1);
  pitch_search(afStack_3c30 + 0x17e,&local_3c38.r,0x3c0,0x24c,&local_8994);
  local_8994 = 0x300 - local_8994;
  oVar12 = remove_doubling(&local_3c38.r,0x300,0x3c,0x3c0,&local_8994,st->last_period,st->last_gain)
  ;
  st->last_period = local_8994;
  st->last_gain = oVar12;
  lVar10 = 0;
  do {
    afStack_61b0[lVar10 + -2] = pfVar5[(int)lVar10 + (0x300 - local_8994)];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x3c0);
  apply_window(&local_61b8.r);
  forward_transform(local_1e38,&local_61b8.r);
  compute_band_energy(local_87b8,local_1e38);
  compute_band_corr(local_88d8,local_8758,local_1e38);
  lVar10 = 0;
  do {
    fVar14 = local_88d8[lVar10];
    dVar2 = (double)(local_8818[lVar10] * local_87b8[lVar10]) + 0.001;
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    local_88d8[lVar10] = (float)((double)fVar14 / dVar2);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x16);
  dct(local_8878,local_88d8);
  uStack_88f8 = uStack_8870;
  local_8900 = local_8878[0];
  local_88f0 = local_8868;
  fStack_88fc = local_8878[1];
  _local_8900 = CONCAT44(fStack_88fc + -0.9,local_8900 + -1.3);
  local_88e8 = (float)(local_8994 + -300) * 0.01;
  fVar13 = 0.0;
  fVar16 = -2.0;
  fVar14 = -2.0;
  lVar10 = 0;
  do {
    local_899c = local_8818[lVar10];
    local_89a0 = fVar14;
    local_8998 = fVar16;
    dVar2 = log10((double)local_899c + 0.01);
    fVar14 = local_89a0 + -1.5;
    fVar16 = fVar14;
    if (fVar14 <= (float)dVar2) {
      fVar16 = (float)dVar2;
    }
    fVar17 = local_8998 + -7.0;
    if (local_8998 + -7.0 <= fVar16) {
      fVar17 = fVar16;
    }
    local_7848[lVar10] = fVar17;
    if (fVar14 <= fVar17) {
      fVar14 = fVar17;
    }
    fVar16 = local_8998;
    if (local_8998 <= fVar17) {
      fVar16 = fVar17;
    }
    fVar13 = fVar13 + local_899c;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x16);
  if (fVar13 < 0.04) {
    memset(local_8988,0,0xa8);
  }
  else {
    pfVar5 = local_8988;
    dct(pfVar5,local_7848);
    local_8988[0] = local_8988[0] + -12.0;
    local_8988[1] = local_8988[1] + -4.0;
    iVar1 = st->memid;
    lVar10 = (long)iVar1;
    uVar9 = (ulong)(iVar1 - 1);
    if (lVar10 < 1) {
      uVar9 = lVar10 + 7;
    }
    pafVar4 = st->cepstral_mem + lVar10;
    lVar3 = 0x16;
    pafVar6 = pafVar4;
    uVar8 = (ulong)(iVar1 - 2);
    if (lVar10 < 2) {
      uVar8 = lVar10 + 6;
    }
    for (; lVar3 != 0; lVar3 = lVar3 + -1) {
      (*pafVar6)[0] = *pfVar5;
      pfVar5 = pfVar5 + (ulong)bVar11 * -2 + 1;
      pafVar6 = (float (*) [22])((long)pafVar6 + (ulong)bVar11 * -8 + 4);
    }
    st->memid = iVar1 + 1;
    lVar10 = 0;
    do {
      fVar14 = (*pafVar4)[lVar10];
      fVar16 = st->cepstral_mem[uVar9][lVar10];
      fVar17 = st->cepstral_mem[uVar8][lVar10];
      local_8988[lVar10] = fVar14 + fVar16 + fVar17;
      afStack_8930[lVar10] = fVar14 - fVar17;
      afStack_8918[lVar10] = (fVar14 - (fVar16 + fVar16)) + fVar17;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 6);
    if (iVar1 + 1 == 8) {
      st->memid = 0;
    }
    fVar14 = 0.0;
    lVar10 = 0;
    pafVar4 = st->cepstral_mem;
    do {
      lVar3 = 0;
      pafVar6 = st->cepstral_mem;
      fVar16 = 1e+15;
      do {
        fVar17 = 0.0;
        lVar7 = 0;
        do {
          fVar15 = (*pafVar4)[lVar7] - (*pafVar6)[lVar7];
          fVar17 = fVar17 + fVar15 * fVar15;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x16);
        if ((lVar3 != lVar10) && (fVar17 <= fVar16)) {
          fVar16 = fVar17;
        }
        lVar3 = lVar3 + 1;
        pafVar6 = pafVar6 + 1;
      } while (lVar3 != 8);
      fVar14 = fVar14 + fVar16;
      lVar10 = lVar10 + 1;
      pafVar4 = pafVar4 + 1;
    } while (lVar10 != 8);
    local_88e4 = fVar14 * 0.125 + -2.1;
  }
  if (0.04 <= fVar13) {
    compute_rnn(&st->rnn,local_8878,&local_89a4,local_8988);
    pitch_filter(local_8758,local_1e38,local_8818,local_87b8,local_88d8,local_8878);
    lVar10 = 0;
    do {
      fVar16 = st->lastg[lVar10] * 0.6;
      fVar14 = local_8878[lVar10];
      if (local_8878[lVar10] <= fVar16) {
        fVar14 = fVar16;
      }
      local_8878[lVar10] = fVar14;
      st->lastg[lVar10] = fVar14;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x16);
    interp_band_gain(local_6948,local_8878);
    lVar10 = 0;
    do {
      fVar14 = local_6948[lVar10];
      local_8758[lVar10].r = local_8758[lVar10].r * fVar14;
      local_8758[lVar10].i = fVar14 * local_8758[lVar10].i;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x1e1);
  }
  check_init();
  memcpy(&local_61b8,local_8758,0xf08);
  lVar10 = 0x1df;
  pfVar5 = local_52b0 + 1;
  do {
    pfVar5[-1] = afStack_61b0[lVar10 * 2 + -2];
    *pfVar5 = -afStack_61b0[lVar10 * 2 + -1];
    pfVar5 = pfVar5 + 2;
    lVar10 = lVar10 + -1;
  } while (lVar10 != 0);
  opus_fft_c(common.kfft,&local_61b8,&local_3c38);
  pfVar5 = local_7848;
  local_7848[0] = local_3c38.r * 960.0;
  lVar10 = 0x3bf;
  do {
    pfVar5 = pfVar5 + 1;
    *pfVar5 = (&local_3c38)[lVar10].r * 960.0;
    lVar10 = lVar10 + -1;
  } while (lVar10 != 0);
  apply_window(local_7848);
  lVar10 = 0;
  do {
    out[lVar10] = local_7848[lVar10] + st->synthesis_mem[lVar10];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x1e0);
  memcpy(st->synthesis_mem,local_70c8,0x780);
  return local_89a4;
}

Assistant:

float rnnoise_process_frame(DenoiseState *st, float *out, const float *in) {
    int i;
    kiss_fft_cpx X[FREQ_SIZE];
    kiss_fft_cpx P[WINDOW_SIZE];
    float x[FRAME_SIZE];
    float Ex[NB_BANDS], Ep[NB_BANDS];
    float Exp[NB_BANDS];
    float features[NB_FEATURES];
    float g[NB_BANDS];
    float gf[FREQ_SIZE] = {1};
    float vad_prob = 0;
    int silence;
    static const float a_hp[2] = {-1.99599, 0.99600};
    static const float b_hp[2] = {-2, 1};
    biquad(x, st->mem_hp_x, in, b_hp, a_hp, FRAME_SIZE); // high pass 高通滤波 抑制50Hz或60Hz的电源干扰
    silence = compute_frame_features(st, X, P, Ex, Ep, Exp, features, x);

    if (!silence) { // 非静音帧
        compute_rnn(&st->rnn, g, &vad_prob, features);
        pitch_filter(X, P, Ex, Ep, Exp, g);
        for (i = 0; i < NB_BANDS; i++) {
            float alpha = .6f;
            g[i] = MAX16(g[i], alpha * st->lastg[i]);
            st->lastg[i] = g[i];
        }
        interp_band_gain(gf, g);
#if 1
        for (i = 0; i < FREQ_SIZE; i++) {
            X[i].r *= gf[i];
            X[i].i *= gf[i];
        }
#endif
    }
    frame_synthesis(st, out, X);
    return vad_prob;
}